

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O3

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::denoise
          (NonIterativeFeaturePreservingMeshFiltering *this)

{
  pointer *ppdVar1;
  undefined1 *__src;
  pointer pVVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ParameterSet *pPVar9;
  double dVar10;
  double sigma_f;
  double dVar11;
  long lVar12;
  pointer pVVar13;
  value_handle vVar14;
  mesh_ptr pPVar15;
  bool bVar16;
  PropertyT<OpenMesh::VectorT<double,_3>_> *pPVar17;
  reference pvVar18;
  long lVar19;
  undefined8 uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  VertexIter VVar31;
  undefined1 local_370 [8];
  TriMesh mesh;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  mollified_normals;
  double local_128;
  double sigma_g_mean_edge_length_ratio;
  double sigma_f_mean_edge_length_ratio;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  undefined1 auStack_e8 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> new_point;
  undefined1 auStack_88 [8];
  vector<double,_std::allocator<double>_> face_area;
  undefined1 local_68 [8];
  VertexIter v_it_1;
  undefined1 auStack_48 [8];
  VertexIter v_it;
  
  DataManager::getNoisyMesh((TriMesh *)local_370,(this->super_MeshDenoisingBase).data_manager_);
  if (mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _168_8_ !=
      mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _160_8_) {
    pPVar9 = (this->super_MeshDenoisingBase).parameter_set_;
    ppdVar1 = &face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
    auStack_88 = (undefined1  [8])ppdVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_88,"sigma_f/mean_edge_length","");
    bVar16 = ParameterSet::getValue(pPVar9,(string *)auStack_88,&sigma_g_mean_edge_length_ratio);
    if (auStack_88 != (undefined1  [8])ppdVar1) {
      operator_delete((void *)auStack_88);
    }
    if (bVar16) {
      pPVar9 = (this->super_MeshDenoisingBase).parameter_set_;
      auStack_88 = (undefined1  [8])ppdVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_88,"sigma_g/mean_edge_length","");
      bVar16 = ParameterSet::getValue(pPVar9,(string *)auStack_88,&local_128);
      if (auStack_88 != (undefined1  [8])ppdVar1) {
        operator_delete((void *)auStack_88);
      }
      if (bVar16) {
        dVar10 = MeshDenoisingBase::getAverageEdgeLength
                           (&this->super_MeshDenoisingBase,(TriMesh *)local_370);
        auStack_88 = (undefined1  [8])0x0;
        face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        MeshDenoisingBase::getFaceArea
                  (&this->super_MeshDenoisingBase,(TriMesh *)local_370,
                   (vector<double,_std::allocator<double>_> *)auStack_88);
        auStack_e8 = (undefined1  [8])0x0;
        face_centroid.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        face_centroid.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        MeshDenoisingBase::getFaceCentroid
                  (&this->super_MeshDenoisingBase,(TriMesh *)local_370,
                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    *)auStack_e8);
        sigma_f = sigma_g_mean_edge_length_ratio * dVar10;
        mesh.super_Mesh.
        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
        .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
        refcount_fcolors_ = 0;
        mesh.super_Mesh.
        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
        .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
        refcount_ftextureIndex_ = 0;
        mollifiedNormals(this,(TriMesh *)local_370,
                         (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)auStack_e8,(vector<double,_std::allocator<double>_> *)auStack_88,sigma_f
                         ,(vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                           *)&mesh.super_Mesh.
                              super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                              .
                              super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                              .refcount_fcolors_);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *)&face_centroid.
                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (long)(mesh.super_Mesh.
                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                      .
                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      ._168_8_ -
                     mesh.super_Mesh.
                     super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                     .
                     super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     ._160_8_) >> 2,(allocator_type *)auStack_48);
        _auStack_48 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_370);
        while( true ) {
          VVar31 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_370);
          vVar14.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
          if (v_it.mesh_._0_4_ == (BaseHandle)VVar31.hnd_.super_BaseHandle.idx_ &&
              auStack_48 == (undefined1  [8])VVar31.mesh_) break;
          pPVar17 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                              ((PropertyContainer *)&mesh,
                               (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                               mesh.super_Mesh.
                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                               .
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               ._412_4_);
          pvVar18 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                              (pPVar17,(int)vVar14.super_BaseHandle.idx_);
          vVar14.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage[(int)v_it.mesh_._0_4_].
          super_VectorDataT<double,_3>.values_[2] =
               (pvVar18->super_VectorDataT<double,_3>).values_[2];
          dVar3 = (pvVar18->super_VectorDataT<double,_3>).values_[1];
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage[(int)v_it.mesh_._0_4_].
          super_VectorDataT<double,_3>.values_[0] =
               (pvVar18->super_VectorDataT<double,_3>).values_[0];
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage[(int)v_it.mesh_._0_4_].
          super_VectorDataT<double,_3>.values_[1] = dVar3;
          pPVar15 = v_it.mesh_;
          v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)vVar14.super_BaseHandle.idx_ + 1);
          if ((ulong)pPVar15 >> 0x20 != 0) {
            OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
            ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                        *)auStack_48);
          }
        }
        _local_68 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_370);
        local_f0 = sigma_f * sigma_f;
        while( true ) {
          VVar31 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_370);
          vVar14.super_BaseHandle.idx_ = v_it_1.mesh_._0_4_;
          if (v_it_1.mesh_._0_4_ == (BaseHandle)VVar31.hnd_.super_BaseHandle.idx_ &&
              local_68 == (undefined1  [8])VVar31.mesh_) break;
          pPVar17 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                              ((PropertyContainer *)&mesh,
                               (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                               mesh.super_Mesh.
                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                               .
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               ._412_4_);
          pvVar18 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                              (pPVar17,(int)vVar14.super_BaseHandle.idx_);
          dVar3 = (pvVar18->super_VectorDataT<double,_3>).values_[0];
          dVar4 = (pvVar18->super_VectorDataT<double,_3>).values_[1];
          dVar5 = (pvVar18->super_VectorDataT<double,_3>).values_[2];
          _auStack_48 = (VertexIter)ZEXT816(0);
          v_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
          v_it.skip_bits_ = 0;
          getVertexFaceNeighbor
                    (this,(TriMesh *)local_370,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)auStack_e8,(VertexHandle)v_it_1.mesh_._0_4_,sigma_f,
                     (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                     auStack_48);
          if ((int)((ulong)((long)v_it.mesh_ - (long)auStack_48) >> 2) < 1) {
            dVar11 = 0.0;
            dVar28 = 0.0;
            dVar27 = 0.0;
            dVar25 = 0.0;
          }
          else {
            dVar25 = 0.0;
            lVar23 = 0;
            dVar27 = 0.0;
            dVar28 = 0.0;
            dVar11 = 0.0;
            do {
              lVar19 = (long)*(int *)((long)&(((mesh_ptr)auStack_48)->super_ArrayKernel).
                                             super_BaseKernel._vptr_BaseKernel + lVar23 * 4);
              lVar12 = lVar19 * 0x18;
              dVar6 = (((pointer)((long)auStack_e8 + lVar19 * 0x18))->super_VectorDataT<double,_3>).
                      values_[0];
              dVar24 = (((pointer)((long)auStack_e8 + lVar19 * 0x18))->super_VectorDataT<double,_3>)
                       .values_[1];
              dVar7 = (((pointer)((long)auStack_e8 + lVar19 * 0x18))->super_VectorDataT<double,_3>).
                      values_[2];
              dVar26 = *(double *)
                        (mesh.super_Mesh.
                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                         .
                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         ._544_8_ + 8 + lVar12);
              dVar8 = *(double *)
                       (mesh.super_Mesh.
                        super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                        .
                        super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                        ._544_8_ + 0x10 + lVar12);
              dVar30 = (dVar5 - dVar7) * dVar8 +
                       (dVar4 - dVar24) * dVar26 +
                       (dVar3 - dVar6) *
                       *(double *)
                        (mesh.super_Mesh.
                         super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                         .
                         super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                         ._544_8_ + lVar12) + 0.0;
              dVar29 = dVar3 - *(double *)
                                (mesh.super_Mesh.
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                 ._544_8_ + lVar12) * dVar30;
              dVar26 = dVar4 - dVar26 * dVar30;
              v_it_1._8_8_ = dVar5 - dVar30 * dVar8;
              dVar6 = dVar6 - dVar3;
              dVar24 = dVar24 - dVar4;
              dVar7 = dVar7 - dVar5;
              dVar6 = SQRT(dVar7 * dVar7 + dVar6 * dVar6 + dVar24 * dVar24);
              sigma_f_mean_edge_length_ratio = dVar25;
              local_110 = dVar27;
              local_108 = dVar28;
              local_100 = dVar11;
              local_f8 = exp((dVar6 * -0.5 * dVar6) / local_f0);
              dVar11 = dVar29 - dVar3;
              dVar25 = dVar26 - dVar4;
              dVar11 = SQRT(((double)v_it_1._8_8_ - dVar5) * ((double)v_it_1._8_8_ - dVar5) +
                            dVar11 * dVar11 + dVar25 * dVar25);
              dVar6 = exp((dVar11 * -0.5 * dVar11) / (dVar10 * local_128 * dVar10 * local_128));
              dVar11 = *(double *)
                        ((long)auStack_88 +
                        (long)*(int *)((long)&(((ArrayKernel *)auStack_48)->super_BaseKernel).
                                              _vptr_BaseKernel + lVar23 * 4) * 8);
              dVar28 = local_108 + dVar29 * dVar11 * local_f8 * dVar6;
              dVar27 = local_110 + dVar26 * dVar11 * local_f8 * dVar6;
              dVar25 = sigma_f_mean_edge_length_ratio +
                       (double)v_it_1._8_8_ * dVar11 * local_f8 * dVar6;
              dVar11 = local_100 + local_f8 * dVar11 * dVar6;
              lVar23 = lVar23 + 1;
            } while (lVar23 < (int)((ulong)((long)v_it.mesh_ - (long)auStack_48) >> 2));
          }
          uVar22 = (ulong)(int)v_it_1.mesh_._0_4_;
          uVar21 = ((long)new_point.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)face_centroid.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                   -0x5555555555555555;
          if (uVar21 < uVar22 || uVar21 - uVar22 == 0) {
            uVar20 = std::__throw_out_of_range_fmt
                               (
                               "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               );
            if (face_centroid.
                super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              operator_delete(face_centroid.
                              super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            if (mesh.super_Mesh.
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                .
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                ._544_8_ != 0) {
              operator_delete((void *)mesh.super_Mesh.
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                      ._544_8_);
            }
            if (auStack_e8 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_e8);
            }
            if (auStack_88 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_88);
            }
            OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_370);
            _Unwind_Resume(uVar20);
          }
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage[uVar22].super_VectorDataT<double,_3>.
          values_[0] = dVar28 / dVar11;
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage[uVar22].super_VectorDataT<double,_3>.
          values_[1] = dVar27 / dVar11;
          face_centroid.
          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage[uVar22].super_VectorDataT<double,_3>.
          values_[2] = dVar25 / dVar11;
          if (auStack_48 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_48);
          }
          pPVar15 = v_it_1.mesh_;
          v_it_1.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)local_68._8_4_.super_BaseHandle + 1);
          if ((ulong)pPVar15 >> 0x20 != 0) {
            OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
            ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                        *)local_68);
          }
        }
        v_it_1._8_8_ = this;
        _auStack_48 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_370);
        while( true ) {
          VVar31 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_370);
          uVar20 = v_it_1._8_8_;
          pVVar13 = face_centroid.
                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          vVar14.super_BaseHandle.idx_ = v_it.mesh_._0_4_;
          if (v_it.mesh_._0_4_ == (BaseHandle)VVar31.hnd_.super_BaseHandle.idx_ &&
              auStack_48 == (undefined1  [8])VVar31.mesh_) break;
          lVar23 = (long)(int)v_it.mesh_._0_4_;
          pPVar17 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                              ((PropertyContainer *)&mesh,
                               (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                               mesh.super_Mesh.
                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                               .
                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                               ._412_4_);
          pvVar18 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                              (pPVar17,(int)vVar14.super_BaseHandle.idx_);
          pVVar2 = pVVar13 + lVar23;
          dVar10 = (pVVar2->super_VectorDataT<double,_3>).values_[1];
          (pvVar18->super_VectorDataT<double,_3>).values_[0] =
               (pVVar2->super_VectorDataT<double,_3>).values_[0];
          (pvVar18->super_VectorDataT<double,_3>).values_[1] = dVar10;
          (pvVar18->super_VectorDataT<double,_3>).values_[2] =
               pVVar13[lVar23].super_VectorDataT<double,_3>.values_[2];
          pPVar15 = v_it.mesh_;
          v_it.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)auStack_48._8_4_.super_BaseHandle + 1);
          if ((ulong)pPVar15 >> 0x20 != 0) {
            OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
            ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                        *)auStack_48);
          }
        }
        lVar23 = *(long *)(v_it_1._8_8_ + 8);
        OpenMesh::PolyConnectivity::operator=
                  ((PolyConnectivity *)(lVar23 + 0x678),(PolyConnectivity *)local_370);
        __src = &mesh.super_Mesh.
                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                 .
                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                 .field_0x19c;
        memcpy((void *)(lVar23 + 0x81c),__src,0x84);
        lVar23 = *(long *)(uVar20 + 8);
        OpenMesh::PolyConnectivity::operator=
                  ((PolyConnectivity *)(lVar23 + 0x450),(PolyConnectivity *)local_370);
        memcpy((void *)(lVar23 + 0x5f4),__src,0x84);
        if (face_centroid.
            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          operator_delete(face_centroid.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        if (mesh.super_Mesh.
            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
            .
            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
            ._544_8_ != 0) {
          operator_delete((void *)mesh.super_Mesh.
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                  ._544_8_);
        }
        if (auStack_e8 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_e8);
        }
        if (auStack_88 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_88);
        }
      }
    }
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_370);
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::denoise()
{
    // get data
    TriMesh mesh = data_manager_->getNoisyMesh();

    if(mesh.n_vertices() == 0)
        return;

    // get parameter
    double sigma_g_mean_edge_length_ratio, sigma_f_mean_edge_length_ratio;
    if(!parameter_set_->getValue(string("sigma_f/mean_edge_length"), sigma_f_mean_edge_length_ratio))
        return;
    if(!parameter_set_->getValue(string("sigma_g/mean_edge_length"), sigma_g_mean_edge_length_ratio))
        return;

    // mesh denoise
    double mean_edge_length = getAverageEdgeLength(mesh);
    std::vector<double> face_area;
    getFaceArea(mesh, face_area);
    std::vector<TriMesh::Point> face_centroid;
    getFaceCentroid(mesh, face_centroid);

    double sigma_f = sigma_f_mean_edge_length_ratio * mean_edge_length;
    double sigma_g = sigma_g_mean_edge_length_ratio * mean_edge_length;

    std::vector<TriMesh::Normal> mollified_normals;
    mollifiedNormals(mesh, face_centroid, face_area, sigma_f, mollified_normals);

    std::vector<TriMesh::Point> new_point(mesh.n_vertices());
    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
        new_point[v_it->idx()] = mesh.point(*v_it);

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        TriMesh::Point pt = mesh.point(*v_it);

        std::vector<TriMesh::FaceHandle> vertex_face_neighbor;
        getVertexFaceNeighbor(mesh, face_centroid, *v_it, sigma_f, vertex_face_neighbor);

        TriMesh::Point temp_point(0.0, 0.0, 0.0);
        double weight_sum = 0.0;

        for(int i = 0; i <(int)vertex_face_neighbor.size(); i++)
        {
            TriMesh::Point centroid = face_centroid[vertex_face_neighbor[i].idx()];
            TriMesh::Normal normal = mollified_normals[vertex_face_neighbor[i].idx()];
            TriMesh::Point projection_point = projectPoint(pt, centroid, normal);

            double distance_spatial = (centroid - pt).length();
            double weight_spatial = std::exp(- 0.5 * distance_spatial * distance_spatial /(sigma_f * sigma_f));

            double distance_influence = (projection_point - pt).length();
            double weight_influence = std::exp(- 0.5 * distance_influence * distance_influence /(sigma_g * sigma_g));

            double area = face_area[vertex_face_neighbor[i].idx()];

            temp_point += projection_point * area * weight_spatial * weight_influence;
            weight_sum += area * weight_spatial * weight_influence;
        }
        temp_point /= weight_sum;

        new_point.at((*v_it).idx()) = temp_point;
    }

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
        mesh.set_point(*v_it, new_point[(*v_it).idx()]);

    // update data
    data_manager_->setMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}